

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O0

void __thiscall
xmrig::CpuLaunchStatus::start
          (CpuLaunchStatus *this,
          vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *threads,size_t memory
          )

{
  size_type sVar1;
  uint64_t uVar2;
  undefined8 in_RDX;
  vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *in_RSI;
  undefined8 *in_RDI;
  
  in_RDI[1] = 0;
  in_RDI[2] = in_RDX;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  *in_RDI = 0;
  sVar1 = std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>::size(in_RSI);
  in_RDI[5] = sVar1;
  in_RDI[6] = 0;
  uVar2 = Chrono::steadyMSecs();
  in_RDI[7] = uVar2;
  return;
}

Assistant:

inline void start(const std::vector<CpuLaunchData> &threads, size_t memory)
    {
        m_hugePages = 0;
        m_memory    = memory;
        m_pages     = 0;
        m_started   = 0;
        m_errors    = 0;
        m_threads   = threads.size();
        m_ways      = 0;
        m_ts        = Chrono::steadyMSecs();
    }